

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O3

Vec_Bit_t * Pla_ManPrimesTable(int nVars)

{
  byte bVar1;
  Vec_Bit_t *pVVar2;
  uint *__s;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong __size;
  
  uVar5 = 1 << ((byte)nVars & 0x1f);
  uVar3 = 0x40;
  if (0x40 < (int)uVar5) {
    uVar3 = uVar5;
  }
  iVar7 = ((uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  iVar6 = iVar7 * 0x20;
  pVVar2->nCap = iVar6;
  __size = (ulong)(uint)(iVar7 * 4);
  __s = (uint *)malloc(__size);
  pVVar2->pArray = (int *)__s;
  memset(__s,0xff,__size);
  uVar3 = uVar5;
  if ((int)uVar5 < 0x40) {
    do {
      if ((nVars == 0x1f) || (iVar6 <= (int)uVar3)) goto LAB_0036ebf7;
      bVar1 = (byte)uVar3 & 0x1f;
      __s[uVar3 >> 5] = __s[uVar3 >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x40);
  }
  if (iVar6 < (int)uVar5) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                  ,0x1ec,"void Vec_BitShrink(Vec_Bit_t *, int)");
  }
  pVVar2->nSize = uVar5;
  if (nVars != 0x1f) {
    uVar3 = *__s;
    *__s = uVar3 & 0xfffffffe;
    if (nVars != 0) {
      *__s = uVar3 & 0xfffffffc;
      if (2 < (int)uVar5) {
        uVar3 = 2;
        do {
          uVar4 = uVar3 * 2;
          if ((int)uVar4 < (int)uVar5 && (__s[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
            do {
              bVar1 = (byte)uVar4 & 0x1f;
              __s[uVar4 >> 5] = __s[uVar4 >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
              uVar4 = uVar4 + uVar3;
            } while ((int)uVar4 < (int)uVar5);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar5);
      }
      return pVVar2;
    }
  }
LAB_0036ebf7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

Vec_Bit_t * Pla_ManPrimesTable( int nVars )
{
    int i, n, nBits = 1 << nVars;
    Vec_Bit_t * vMap = Vec_BitStartFull( Abc_MaxInt(64, nBits) );
    for ( i = nBits; i < 64; i++ )
        Vec_BitWriteEntry( vMap, i, 0 );
    Vec_BitShrink( vMap, nBits );
    Vec_BitWriteEntry( vMap, 0, 0 );
    Vec_BitWriteEntry( vMap, 1, 0 );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            for ( i = 2*n; i < nBits; i += n )
                Vec_BitWriteEntry( vMap, i, 0 );
    return vMap;
}